

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O0

AActor * P_SpawnSubMissile(AActor *source,PClassActor *type,AActor *target)

{
  double dVar1;
  PClassActor *angle;
  uint uVar2;
  bool bVar3;
  double dVar4;
  TAngle<double> local_70;
  undefined1 local_68 [16];
  DAngle pitch;
  TFlags<ActorFlag,_unsigned_int> local_50;
  TFlags<ActorFlag4,_unsigned_int> local_4c;
  DVector3 local_48;
  AActor *local_30;
  AActor *other;
  AActor *target_local;
  PClassActor *type_local;
  AActor *source_local;
  
  other = target;
  target_local = (AActor *)type;
  type_local = (PClassActor *)source;
  AActor::Pos(&local_48,source);
  local_30 = Spawn(type,&local_48,ALLOW_REPLACE);
  if ((type_local == (PClassActor *)0x0) || (target_local == (AActor *)0x0)) {
    source_local = (AActor *)0x0;
  }
  else {
    TObjPtr<AActor>::operator=(&local_30->target,other);
    TAngle<double>::operator=
              (&(local_30->Angles).Yaw,
               (TAngle<double> *)
               &(type_local->super_PClass).super_PNativeStruct.super_PStruct.Fields.Most);
    AActor::VelFromAngle(local_30);
    TFlags<ActorFlag4,_unsigned_int>::operator&
              (&local_4c,
               (int)local_30 + (MF4_STRIFEDAMAGE|MF4_ACTLIKEBRIDGE|MF4_FIXMAPTHINGPOS|MF4_BOSSDEATH)
              );
    uVar2 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_4c);
    if (uVar2 != 0) {
      TFlags<ActorFlag,_unsigned_int>::operator&
                (&local_50,
                 (int)type_local +
                 (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|MF_SHOOTABLE))
      ;
      uVar2 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_50);
      bVar3 = false;
      if (uVar2 != 0) {
        TFlags<ActorFlag4,_unsigned_int>::operator&
                  ((TFlags<ActorFlag4,_unsigned_int> *)((long)&pitch.Degrees + 4),
                   (int)type_local +
                   (MF4_STRIFEDAMAGE|MF4_ACTLIKEBRIDGE|MF4_FIXMAPTHINGPOS|MF4_BOSSDEATH));
        uVar2 = TFlags::operator_cast_to_unsigned_int((TFlags *)((long)&pitch.Degrees + 4));
        bVar3 = uVar2 != 0;
      }
      if (bVar3) {
        local_30->FriendPlayer = *(BYTE *)((long)&type_local[1].distancecheck + 6);
      }
      else {
        AActor::SetFriendPlayer(local_30,other->player);
      }
    }
    bVar3 = P_CheckMissileSpawn(local_30,type_local->BurnHeight);
    angle = type_local;
    if (bVar3) {
      TAngle<double>::TAngle
                ((TAngle<double> *)local_68,
                 (TAngle<double> *)
                 &(type_local->super_PClass).super_PNativeStruct.super_PStruct.Fields.Most);
      TAngle<double>::TAngle(&local_70,0.0);
      P_AimLineAttack((AActor *)(local_68 + 8),(DAngle *)angle,1024.0,
                      (FTranslatedLineTarget *)local_68,(DAngle *)0x0,(int)&local_70,(AActor *)0x0,
                      (AActor *)0x0);
      dVar1 = local_30->Speed;
      dVar4 = TAngle<double>::Sin((TAngle<double> *)(local_68 + 8));
      (local_30->Vel).Z = -dVar1 * dVar4;
      source_local = local_30;
    }
    else {
      source_local = (AActor *)0x0;
    }
  }
  return source_local;
}

Assistant:

AActor *P_SpawnSubMissile(AActor *source, PClassActor *type, AActor *target)
{
	AActor *other = Spawn(type, source->Pos(), ALLOW_REPLACE);

	if (source == nullptr || type == nullptr)
	{
		return nullptr;
	}

	other->target = target;
	other->Angles.Yaw = source->Angles.Yaw;
	other->VelFromAngle();

	if (other->flags4 & MF4_SPECTRAL)
	{
		if (source->flags & MF_MISSILE && source->flags4 & MF4_SPECTRAL)
		{
			other->FriendPlayer = source->FriendPlayer;
		}
		else
		{
			other->SetFriendPlayer(target->player);
		}
	}

	if (P_CheckMissileSpawn(other, source->radius))
	{
		DAngle pitch = P_AimLineAttack(source, source->Angles.Yaw, 1024.);
		other->Vel.Z = -other->Speed * pitch.Sin();
		return other;
	}
	return NULL;
}